

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environ.cpp
# Opt level: O0

DWORD GetEnvironmentVariableA(LPCSTR lpName,LPSTR lpBuffer,DWORD nSize)

{
  char *pcVar1;
  size_t sVar2;
  undefined4 local_2c;
  char *pcStack_28;
  DWORD dwRet;
  char *value;
  DWORD nSize_local;
  LPSTR lpBuffer_local;
  LPCSTR lpName_local;
  
  local_2c = 0;
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  if (lpName == (LPCSTR)0x0) {
    if (!PAL_InitializeChakraCoreCalled) {
      abort();
    }
    SetLastError(0x57);
  }
  else if (*lpName == '\0') {
    if (!PAL_InitializeChakraCoreCalled) {
      abort();
    }
    SetLastError(0xcb);
  }
  else {
    pcVar1 = strchr(lpName,0x3d);
    if (pcVar1 == (char *)0x0) {
      pcStack_28 = MiscGetenv(lpName);
    }
    else {
      pcStack_28 = (char *)0x0;
    }
    if (pcStack_28 == (char *)0x0) {
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
      SetLastError(0xcb);
    }
    else {
      sVar2 = strlen(pcStack_28);
      if (sVar2 < nSize) {
        strcpy_s(lpBuffer,(ulong)nSize,pcStack_28);
        sVar2 = strlen(pcStack_28);
        local_2c = (DWORD)sVar2;
      }
      else {
        sVar2 = strlen(pcStack_28);
        local_2c = (int)sVar2 + 1;
      }
      SetLastError(0);
    }
  }
  if ((PAL_InitializeChakraCoreCalled & 1U) != 0) {
    return local_2c;
  }
  abort();
}

Assistant:

DWORD
PALAPI
GetEnvironmentVariableA(
            IN LPCSTR lpName,
            OUT LPSTR lpBuffer,
            IN DWORD nSize)
{
    char  *value;
    DWORD dwRet = 0;

    PERF_ENTRY(GetEnvironmentVariableA);
    ENTRY("GetEnvironmentVariableA(lpName=%p (%s), lpBuffer=%p, nSize=%u)\n",
        lpName?lpName:"NULL",
        lpName?lpName:"NULL", lpBuffer, nSize);
    
    if (lpName == NULL)
    {
        ERROR("lpName is NULL\n");
        SetLastError(ERROR_INVALID_PARAMETER);
        goto done;
    }

    if (lpName[0] == 0)
    {
        TRACE("lpName is empty string\n", lpName);
        SetLastError(ERROR_ENVVAR_NOT_FOUND);
        goto done;
    }
    
    if (strchr(lpName, '=') != NULL)
    {
        // GetEnvironmentVariable doesn't permit '=' in variable names.
        value = NULL;
    }
    else
    {
        value = MiscGetenv(lpName);
    }
    
    if (value == NULL)
    {
        TRACE("%s is not found\n", lpName);
        SetLastError(ERROR_ENVVAR_NOT_FOUND);
        goto done;
    }

    if (strlen(value) < nSize)
    {
        strcpy_s(lpBuffer, nSize, value);
        dwRet = strlen(value);
    } 
    else 
    {
        dwRet = strlen(value)+1;
    }
    SetLastError(ERROR_SUCCESS);

done:
    LOGEXIT("GetEnvironmentVariableA returns DWORD 0x%x\n", dwRet);
    PERF_EXIT(GetEnvironmentVariableA);
    return dwRet;
}